

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O0

iterator __thiscall
QJsonObject::insertAt<QStringView>
          (QJsonObject *this,qsizetype pos,QStringView key,QJsonValue *value,bool keyExists)

{
  long lVar1;
  QJsonValueRef QVar2;
  QStringView s;
  bool bVar3;
  QCborContainerPrivate *pQVar4;
  QCborValue *in_RSI;
  byte in_R9B;
  long in_FS_OFFSET;
  QCborContainerPrivate *in_stack_ffffffffffffff08;
  QCborContainerPrivate *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  ContainerDisposition in_stack_ffffffffffffff1c;
  QCborValue *in_stack_ffffffffffffff20;
  ContainerDisposition disp;
  QJsonObject *in_stack_ffffffffffffff28;
  QCborValue *value_00;
  QCborContainerPrivate *in_stack_ffffffffffffff30;
  QCborContainerPrivate *in_stack_ffffffffffffff38;
  QCborContainerPrivate *this_00;
  undefined8 local_60;
  undefined8 local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b35b3);
  if (bVar3) {
    pQVar4 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b35c3);
    QList<QtCbor::Element>::size(&pQVar4->elements);
    detach(in_stack_ffffffffffffff28,(qsizetype)in_stack_ffffffffffffff20);
  }
  else {
    operator_new(0x40);
    QCborContainerPrivate::QCborContainerPrivate(in_stack_ffffffffffffff10);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
  }
  if ((in_R9B & 1) == 0) {
    pQVar4 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b368f);
    disp = (ContainerDisposition)((ulong)pQVar4 >> 0x20);
    s.m_size = (qsizetype)in_stack_ffffffffffffff38;
    s.m_data = (storage_type_conflict *)in_stack_ffffffffffffff30;
    value_00 = in_RSI;
    QCborValue::QCborValue
              ((QCborValue *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),s);
    QCborContainerPrivate::insertAt
              (in_stack_ffffffffffffff38,(qsizetype)in_stack_ffffffffffffff30,value_00,disp);
    QCborValue::~QCborValue((QCborValue *)in_stack_ffffffffffffff10);
    pQVar4 = QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b3705);
    this_00 = (QCborContainerPrivate *)((long)&in_RSI->n + 1);
    QCborValue::fromJsonValue
              ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QCborContainerPrivate::insertAt(this_00,(qsizetype)pQVar4,value_00,disp);
    QCborValue::~QCborValue((QCborValue *)in_stack_ffffffffffffff10);
  }
  else {
    QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x1b3635);
    QCborValue::fromJsonValue
              ((QJsonValue *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QCborContainerPrivate::replaceAt
              (in_stack_ffffffffffffff30,(qsizetype)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    QCborValue::~QCborValue((QCborValue *)in_stack_ffffffffffffff10);
  }
  iterator::iterator((iterator *)in_stack_ffffffffffffff10,(QJsonObject *)in_stack_ffffffffffffff08,
                     0x1b3774);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.super_QJsonValueConstRef._8_4_ = (int)local_58;
    QVar2.super_QJsonValueConstRef.d = (QCborContainerPrivate *)local_60;
    QVar2.super_QJsonValueConstRef._12_4_ = (int)((ulong)local_58 >> 0x20);
    return (QJsonValueRef)(QJsonValueRef)QVar2.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertAt(qsizetype pos, T key, const QJsonValue &value, bool keyExists)
{
    if (o)
        detach(o->elements.size() / 2 + (keyExists ? 0 : 1));
    else
        o = new QCborContainerPrivate;

    if (keyExists) {
        o->replaceAt(pos + 1, QCborValue::fromJsonValue(value));
    } else {
        o->insertAt(pos, key);
        o->insertAt(pos + 1, QCborValue::fromJsonValue(value));
    }
    return {this, pos / 2};
}